

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

Scroll * __thiscall tli_window_manager::Scroll::operator=(Scroll *this,Scroll *other)

{
  int iVar1;
  
  iVar1 = (this->super_Box).width_;
  (this->super_Box).width_ = (other->super_Box).width_;
  (other->super_Box).width_ = iVar1;
  iVar1 = (this->super_Box).height_;
  (this->super_Box).height_ = (other->super_Box).height_;
  (other->super_Box).height_ = iVar1;
  iVar1 = this->scroll_height_;
  this->scroll_height_ = other->scroll_height_;
  other->scroll_height_ = iVar1;
  iVar1 = this->slider_position_;
  this->slider_position_ = other->slider_position_;
  other->slider_position_ = iVar1;
  return this;
}

Assistant:

Scroll &Scroll::operator=(Scroll other) noexcept {
    swap(*this, other);
    return *this;
}